

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxplus.cpp
# Opt level: O1

double __thiscall libDAI::MaxPlus::run(MaxPlus *this)

{
  size_t *psVar1;
  value vVar2;
  pointer pTVar3;
  FactorGraph *pFVar4;
  undefined1 *puVar5;
  pointer pVVar6;
  bool bVar7;
  char cVar8;
  pointer puVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  undefined4 extraout_var;
  ostream *poVar14;
  long lVar15;
  size_type sVar16;
  ulong uVar17;
  iterator iVar18;
  long *plVar19;
  pointer pVVar20;
  _Node *p_Var21;
  undefined8 *puVar22;
  long lVar23;
  long lVar24;
  double *pdVar25;
  double *pdVar26;
  long lVar27;
  double *pdVar28;
  long lVar29;
  unsigned_long uVar30;
  unsigned_long uVar31;
  pointer puVar32;
  size_t i;
  ulong uVar33;
  size_t sVar34;
  pointer *__x;
  list<std::pair<double,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<double,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
  *plVar35;
  long *plVar36;
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined8 in_XMM3_Qb;
  Prob ECV;
  vector<double,_std::allocator<double>_> residuals;
  vector<unsigned_long,_std::allocator<unsigned_long>_> edge_seq;
  vector<unsigned_long,_std::allocator<unsigned_long>_> max_indices;
  Diffs diffs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> v_empty;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> old_beliefs;
  timeval cur_time;
  timeval start_time;
  pointer local_1a8;
  pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_190;
  double local_170;
  allocator_type local_161;
  list<std::pair<double,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<double,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
  *local_160;
  vector<double,_std::allocator<double>_> local_158;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_138;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_118;
  Diffs local_100;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  clock_t local_a8;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *local_a0;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> local_98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_80;
  double local_78;
  VarSet local_70;
  timeval local_50;
  timeval local_40;
  long *plVar13;
  
  iVar12 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])();
  plVar13 = (long *)CONCAT44(extraout_var,iVar12);
  this->bestValue = -INFINITY;
  if (1 < (this->Props).verbose) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Starting ",9);
    (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[9])(&local_100,this);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         (char *)local_100.super_vector<double,_std::allocator<double>_>.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start,
                         (long)local_100.super_vector<double,_std::allocator<double>_>.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"...",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
    if ((pointer *)
        local_100.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        != &local_100.super_vector<double,_std::allocator<double>_>.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
      operator_delete(local_100.super_vector<double,_std::allocator<double>_>.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_100.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1);
    }
  }
  if (2 < (this->Props).verbose) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
  }
  iVar12 = gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  if (iVar12 != 0) {
    puVar22 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar22 = "Error with gettimeofday";
    __cxa_throw(puVar22,&char_const*::typeinfo,0);
  }
  local_a8 = toc();
  lVar15 = (**(code **)(*plVar13 + 0x28))(plVar13);
  Diffs::Diffs(&local_100,lVar15,1.0);
  local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_98.super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar16 = (**(code **)(*plVar13 + 0x28))(plVar13);
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::reserve
            (&local_98,sVar16);
  for (uVar33 = 0; uVar17 = (**(code **)(*plVar13 + 0x28))(), uVar33 < uVar17; uVar33 = uVar33 + 1)
  {
    lVar15 = (**(code **)(*plVar13 + 0x30))(plVar13,uVar33);
    local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_190,*(size_type *)(lVar15 + 8),
               (value_type_conflict3 *)&local_118,(allocator_type *)&local_c8);
    std::vector<libDAI::TProb<double>,std::allocator<libDAI::TProb<double>>>::
    emplace_back<libDAI::TProb<double>>
              ((vector<libDAI::TProb<double>,std::allocator<libDAI::TProb<double>>> *)&local_98,
               (TProb<double> *)&local_190);
    if ((pointer)local_190.first != (pointer)0x0) {
      operator_delete((void *)local_190.first,
                      (long)local_190.second.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)local_190.first);
    }
  }
  sVar16 = plVar13[9] - plVar13[8] >> 4;
  if ((this->Props).updates.v == SEQMAX) {
    if (plVar13[9] != plVar13[8]) {
      sVar34 = 0;
      do {
        calcNewMessage(this,sVar34);
        sVar34 = sVar34 + 1;
        sVar16 = plVar13[9] - plVar13[8] >> 4;
      } while (sVar34 < sVar16);
    }
    std::vector<double,_std::allocator<double>_>::reserve(&local_158,sVar16);
    if (plVar13[9] != plVar13[8]) {
      uVar33 = 0;
      do {
        pTVar3 = (this->_newmessages).
                 super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar15 = *(long *)&pTVar3[uVar33]._p.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl;
        lVar23 = (long)pTVar3[uVar33]._p.super__Vector_base<double,_std::allocator<double>_>._M_impl
                       .super__Vector_impl_data._M_finish - lVar15;
        if (lVar23 == 0) {
          local_190.first = 0.0;
        }
        else {
          lVar23 = lVar23 >> 3;
          auVar38 = ZEXT816(0);
          lVar27 = 0;
          auVar44._8_8_ = 0x7fffffffffffffff;
          auVar44._0_8_ = 0x7fffffffffffffff;
          do {
            auVar39._8_8_ = 0;
            auVar39._0_8_ =
                 *(double *)(lVar15 + lVar27 * 8) -
                 *(double *)
                  (*(long *)&(this->_messages).
                             super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar33]._p.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl +
                  lVar27 * 8);
            auVar39 = vandpd_avx(auVar39,auVar44);
            auVar38 = vmaxsd_avx(auVar39,auVar38);
            local_190.first = auVar38._0_8_;
            lVar27 = lVar27 + 1;
          } while (lVar23 + (ulong)(lVar23 == 0) != lVar27);
        }
        if (local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&local_158,
                     (iterator)
                     local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_190.first);
        }
        else {
          *local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_190.first;
          local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        uVar33 = uVar33 + 1;
      } while (uVar33 < (ulong)(plVar13[9] - plVar13[8] >> 4));
    }
  }
  else {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_138,sVar16);
    local_190.first = 0.0;
    if (plVar13[9] != plVar13[8]) {
      do {
        if (local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_138,
                     (iterator)
                     local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_190);
        }
        else {
          *local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = (unsigned_long)local_190.first;
          local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_190.first = (double)((long)local_190.first + 1);
      } while ((ulong)local_190.first < (pointer)(plVar13[9] - plVar13[8] >> 4));
    }
  }
  this->_iterations = 0;
  if ((this->Props).maxiter != 0) {
    local_a0 = &this->_messages;
    local_160 = (list<std::pair<double,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<double,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                 *)&this->_valConfs;
    local_80 = &this->bestConfiguration;
    do {
      iVar18._M_current = &local_100._def;
      if (local_100._maxsize <=
          (ulong)((long)local_100.super_vector<double,_std::allocator<double>_>.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_100.super_vector<double,_std::allocator<double>_>.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3)) {
        iVar18._M_current = local_100._maxpos._M_current;
      }
      if (*iVar18._M_current <= (this->Props).tol) break;
      if (5 < (this->Props).verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Start iteration ",0x10);
        poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
        std::ostream::put((char)poVar14);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"old messages:",0xd);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
        std::ostream::put(-0x50);
        poVar14 = (ostream *)std::ostream::flush();
        poVar14 = libDAI::operator<<(poVar14,local_a0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
        std::ostream::put((char)poVar14);
        std::ostream::flush();
      }
      puVar9 = local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar32 = local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      vVar2 = (this->Props).updates.v;
      if (vVar2 == SEQRND) {
        if ((local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start !=
             local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish) &&
           (local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start + 1 !=
            local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish)) {
          lVar15 = 8;
          do {
            iVar12 = rand();
            lVar23 = (long)iVar12 % ((lVar15 >> 3) + 1);
            if (lVar15 != lVar23 * 8) {
              uVar30 = *(unsigned_long *)((long)puVar32 + lVar15);
              *(unsigned_long *)((long)puVar32 + lVar15) = puVar32[lVar23];
              puVar32[lVar23] = uVar30;
            }
            lVar23 = lVar15 + 8;
            lVar15 = lVar15 + 8;
          } while ((unsigned_long *)((long)puVar32 + lVar23) != puVar9);
        }
LAB_004e08f5:
        if (plVar13[9] != plVar13[8]) {
          uVar33 = 0;
          do {
            sVar34 = local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar33];
            calcNewMessage(this,sVar34);
            updateMessage(this,sVar34);
            uVar33 = uVar33 + 1;
          } while (uVar33 < (ulong)(plVar13[9] - plVar13[8] >> 4));
        }
      }
      else if (vVar2 == SEQMAX) {
        if (plVar13[9] != plVar13[8]) {
          dVar37 = 0.0;
          do {
            pdVar25 = local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + 1;
            pdVar26 = local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar28 = local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (pdVar25 !=
                local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish &&
                local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              do {
                pdVar26 = pdVar25;
                if (*pdVar25 <= *pdVar28) {
                  pdVar26 = pdVar28;
                }
                pdVar25 = pdVar25 + 1;
                pdVar28 = pdVar26;
              } while (pdVar25 !=
                       local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
            }
            lVar15 = (long)pdVar26 -
                     (long)local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
            sVar34 = lVar15 >> 3;
            local_170 = dVar37;
            updateMessage(this,sVar34);
            *(undefined8 *)
             ((long)local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar15) = 0;
            lVar23 = sVar34 * 0x10;
            lVar15 = *(long *)(plVar13[8] + lVar23);
            plVar19 = *(long **)(plVar13[0xe] + lVar15 * 0x18);
            if (plVar19 != *(long **)(plVar13[0xe] + 8 + lVar15 * 0x18)) {
              lVar23 = *(long *)(plVar13[8] + 8 + lVar23);
              do {
                if (*plVar19 != lVar23) {
                  lVar27 = plVar13[0x11];
                  lVar24 = *plVar19;
                  for (plVar36 = *(long **)(lVar27 + *plVar19 * 0x18);
                      plVar36 != *(long **)(lVar27 + 8 + lVar24 * 0x18); plVar36 = plVar36 + 1) {
                    if (*plVar36 != lVar15) {
                      sVar34 = *(size_t *)(*(long *)(plVar13[0xb] + *plVar36 * 0x18) + lVar24 * 8);
                      calcNewMessage(this,sVar34);
                      pTVar3 = (this->_newmessages).
                               super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      lVar27 = *(long *)&pTVar3[sVar34]._p.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                      ;
                      lVar24 = (long)pTVar3[sVar34]._p.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish - lVar27;
                      if (lVar24 == 0) {
                        dVar37 = 0.0;
                      }
                      else {
                        lVar24 = lVar24 >> 3;
                        auVar38 = ZEXT816(0);
                        lVar29 = 0;
                        auVar45._8_8_ = 0x7fffffffffffffff;
                        auVar45._0_8_ = 0x7fffffffffffffff;
                        do {
                          auVar40._8_8_ = 0;
                          auVar40._0_8_ =
                               *(double *)(lVar27 + lVar29 * 8) -
                               *(double *)
                                (*(long *)&(this->_messages).
                                           super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[sVar34]._p.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl + lVar29 * 8);
                          auVar44 = vandpd_avx(auVar40,auVar45);
                          auVar38 = vmaxsd_avx(auVar44,auVar38);
                          dVar37 = auVar38._0_8_;
                          lVar29 = lVar29 + 1;
                        } while (lVar24 + (ulong)(lVar24 == 0) != lVar29);
                      }
                      local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[sVar34] = dVar37;
                    }
                    lVar24 = *plVar19;
                    lVar27 = plVar13[0x11];
                  }
                }
                plVar19 = plVar19 + 1;
              } while (plVar19 != *(long **)(plVar13[0xe] + 8 + lVar15 * 0x18));
            }
            dVar37 = (double)((long)local_170 + 1);
          } while ((ulong)dVar37 < (ulong)(plVar13[9] - plVar13[8] >> 4));
        }
      }
      else {
        if (vVar2 != PARALL) goto LAB_004e08f5;
        if (plVar13[9] != plVar13[8]) {
          sVar34 = 0;
          do {
            calcNewMessage(this,sVar34);
            sVar34 = sVar34 + 1;
          } while (sVar34 < (ulong)(plVar13[9] - plVar13[8] >> 4));
        }
        if (plVar13[9] != plVar13[8]) {
          sVar34 = 0;
          do {
            updateMessage(this,sVar34);
            sVar34 = sVar34 + 1;
          } while (sVar34 < (ulong)(plVar13[9] - plVar13[8] >> 4));
        }
      }
      sVar16 = (**(code **)(*plVar13 + 0x28))(plVar13);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_118,sVar16,(allocator_type *)&local_190);
      for (uVar33 = 0; uVar17 = (**(code **)(*plVar13 + 0x28))(plVar13), uVar33 < uVar17;
          uVar33 = uVar33 + 1) {
        lVar15 = (**(code **)(*plVar13 + 0x30))(plVar13,uVar33);
        local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&local_190,*(size_type *)(lVar15 + 8),
                   (value_type_conflict3 *)&local_c8,&local_161);
        plVar19 = *(long **)(plVar13[0xe] + uVar33 * 0x18);
        plVar36 = *(long **)(plVar13[0xe] + 8 + uVar33 * 0x18);
        if (plVar19 != plVar36) {
          pTVar3 = (this->_messages).
                   super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pFVar4 = this->_g;
          lVar15 = (long)local_190.second.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start - (long)local_190.first >> 3;
          do {
            if (local_190.second.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)local_190.first) {
              lVar23 = *(long *)&pTVar3[*(long *)(*(long *)&(pFVar4->_fg)._E12ind.
                                                                                                                        
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar33].
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data + *plVar19 * 8)].
                                 _p.super__Vector_base<double,_std::allocator<double>_>._M_impl;
              lVar27 = 0;
              do {
                *(double *)((long)local_190.first + lVar27 * 8) =
                     *(double *)(lVar23 + lVar27 * 8) +
                     *(double *)((long)local_190.first + lVar27 * 8);
                lVar27 = lVar27 + 1;
              } while (lVar15 + (ulong)(lVar15 == 0) != lVar27);
            }
            plVar19 = plVar19 + 1;
          } while (plVar19 != plVar36);
        }
        lVar15 = (long)local_190.second.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start - (long)local_190.first >> 3;
        if (local_190.second.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start == (pointer)local_190.first) {
          uVar30 = 0;
        }
        else {
          auVar38 = ZEXT816(0xfff0000000000000);
          uVar30 = 0;
          uVar31 = 0;
          do {
            auVar41._8_8_ = 0;
            auVar41._0_8_ = *(double *)((long)local_190.first + uVar31 * 8);
            if (auVar38._0_8_ < *(double *)((long)local_190.first + uVar31 * 8)) {
              uVar30 = uVar31;
            }
            auVar38 = vmaxsd_avx(auVar41,auVar38);
            uVar31 = uVar31 + 1;
          } while (lVar15 + (ulong)(lVar15 == 0) != uVar31);
        }
        local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar33] = uVar30;
        if (local_190.second.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start == (pointer)local_190.first) {
          dVar37 = 0.0;
        }
        else {
          auVar38 = ZEXT816(0);
          lVar23 = 0;
          auVar46._8_8_ = 0x7fffffffffffffff;
          auVar46._0_8_ = 0x7fffffffffffffff;
          do {
            auVar42._8_8_ = 0;
            auVar42._0_8_ =
                 *(double *)((long)local_190.first + lVar23 * 8) -
                 local_98.
                 super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar33]._p.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar23];
            auVar44 = vandpd_avx(auVar42,auVar46);
            auVar38 = vmaxsd_avx(auVar44,auVar38);
            dVar37 = auVar38._0_8_;
            lVar23 = lVar23 + 1;
          } while (lVar15 + (ulong)(lVar15 == 0) != lVar23);
        }
        Diffs::push(&local_100,dVar37);
        if ((pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
            (local_98.
             super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start + uVar33) != &local_190) {
          std::vector<double,_std::allocator<double>_>::operator=
                    ((vector<double,_std::allocator<double>_> *)
                     (local_98.
                      super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar33),
                     (vector<double,_std::allocator<double>_> *)&local_190);
        }
        if ((pointer)local_190.first != (pointer)0x0) {
          operator_delete((void *)local_190.first,
                          (long)local_190.second.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)local_190.first);
        }
      }
      if (2 < (this->Props).verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"MaxPlus::run:  maxdiff ",0x17);
        iVar18._M_current = &local_100._def;
        if (local_100._maxsize <=
            (ulong)((long)local_100.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_100.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3)) {
          iVar18._M_current = local_100._maxpos._M_current;
        }
        poVar14 = std::ostream::_M_insert<double>(*iVar18._M_current);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14," after ",7);
        poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14," passes",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
        std::ostream::put((char)poVar14);
        std::ostream::flush();
      }
      plVar19 = (long *)(**(code **)(*plVar13 + 0x58))();
      __x = (pointer *)*plVar19;
      puVar5 = (undefined1 *)plVar19[1];
      if (__x == (pointer *)puVar5) {
        local_1a8 = (pointer)0x0;
      }
      else {
        local_1a8 = (pointer)0x0;
        do {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_190,
                     (long)__x[1] - (long)*__x >> 4,(allocator_type *)&local_c8);
          pVVar20 = *__x;
          pVVar6 = __x[1];
          if (pVVar20 != pVVar6) {
            puVar32 = (pointer)local_190.first;
            do {
              if ((ulong)((long)local_118.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_118.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3) <=
                  (ulong)pVVar20->_label) {
                std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
              }
              *puVar32 = local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start[pVVar20->_label];
              pVVar20 = pVVar20 + 1;
              puVar32 = puVar32 + 1;
            } while (pVVar20 != pVVar6);
          }
          std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::vector
                    (&local_70._vars,(vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)__x);
          local_70._statespace =
               (size_t)(((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)(__x + 3))->
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>)._M_impl.
                       super__Vector_impl_data._M_start;
          sVar34 = TFactor<double>::IndividualToJointFactorIndex
                             (&local_70,
                              (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_190);
          if (local_70._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_70._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_70._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_70._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          local_1a8 = (pointer)((double)local_1a8 + (double)(&__x[4]->_label)[sVar34]);
          if ((pointer)local_190.first != (pointer)0x0) {
            operator_delete((void *)local_190.first,
                            (long)local_190.second.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)local_190.first)
            ;
          }
          __x = __x + 7;
        } while (__x != (pointer *)puVar5);
      }
      if (2 < (this->Props).verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"current estimated maximizing configuration attains: ",0x34
                  );
        poVar14 = std::ostream::_M_insert<double>((double)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14," (the k=",8);
        poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"-th Value is ",0xd);
        poVar14 = std::ostream::_M_insert<double>(this->_k_th_Val);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,")",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
        std::ostream::put((char)poVar14);
        std::ostream::flush();
      }
      if (this->_k_th_Val + 1e-09 < (double)local_1a8) {
        if (3 < (this->Props).verbose) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\tchecking to add this configuration to solutions",0x30)
          ;
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
          std::ostream::put(-0x50);
          std::ostream::flush();
        }
        plVar35 = *(list<std::pair<double,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<double,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                    **)local_160;
        local_78 = (double)local_1a8 + 1e-09;
        iVar12 = 0;
        bVar11 = true;
        for (; plVar35 != local_160;
            plVar35 = *(list<std::pair<double,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<double,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                        **)plVar35) {
          local_170 = *(double *)(plVar35 + 0x10);
          if (4 < (this->Props).verbose) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "\tchecking to see if it should be inserted before the entry at position ",
                       0x47);
            poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar12);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14," (with value ",0xd);
            poVar14 = std::ostream::_M_insert<double>(local_170);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,")...",4);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
            std::ostream::put((char)poVar14);
            std::ostream::flush();
          }
          bVar7 = local_78 < local_170;
          if ((local_78 < local_170) && (4 < (this->Props).verbose)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\tYes!  valuesum(",0x10);
            poVar14 = std::ostream::_M_insert<double>((double)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,") + V_EPS(",10);
            poVar14 = std::ostream::_M_insert<double>(1e-09);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,") < vcval(",10);
            poVar14 = std::ostream::_M_insert<double>(local_170);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14," )",2);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
            std::ostream::put((char)poVar14);
            std::ostream::flush();
          }
          bVar10 = MADP_util::EqualValue(local_170,(double)local_1a8);
          if (bVar10) {
            if (4 < (this->Props).verbose) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"\tYes!  valuesum(",0x10);
              poVar14 = std::ostream::_M_insert<double>((double)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,") + V_EPS(",10);
              poVar14 = std::ostream::_M_insert<double>(1e-09);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,") == vcval(",0xb);
              poVar14 = std::ostream::_M_insert<double>(local_170);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14," )",2);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
              std::ostream::put((char)poVar14);
              std::ostream::flush();
            }
            lVar15 = *(long *)(plVar35 + 0x20) - *(long *)(plVar35 + 0x18);
            if (lVar15 != 0) {
              lVar15 = lVar15 >> 3;
              lVar23 = (long)local_118.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_118.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3;
              lVar27 = 0;
              do {
                if (lVar23 == lVar27) {
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,lVar23);
                }
                if (local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar27] !=
                    *(unsigned_long *)(*(long *)(plVar35 + 0x18) + lVar27 * 8)) {
                  bVar7 = true;
                  goto LAB_004e1177;
                }
                lVar27 = lVar27 + 1;
              } while (lVar15 + (ulong)(lVar15 == 0) != lVar27);
            }
            bVar7 = true;
            if (3 < (this->Props).verbose) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "\tnewly found conf identical to one already stored...",0x34);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
              std::ostream::put(-0x50);
              std::ostream::flush();
            }
            bVar11 = false;
          }
LAB_004e1177:
          if (bVar7) break;
          iVar12 = iVar12 + 1;
        }
        if ((plVar35 ==
             *(list<std::pair<double,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<double,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
               **)local_160) &&
           ((this->_valConfs).
            super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
            ._M_impl._M_node._M_size == this->_k)) {
          if (3 < (this->Props).verbose) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\tDon\'t bother value (",0x15);
            poVar14 = std::ostream::_M_insert<double>((double)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,") not high enough...",0x14);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
            std::ostream::put((char)poVar14);
            std::ostream::flush();
          }
          bVar11 = false;
        }
        if (bVar11) {
          local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_190.first = (double)local_1a8;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_190.second,&local_c8);
          p_Var21 = std::__cxx11::
                    list<std::pair<double,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<double,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                    ::
                    _M_create_node<std::pair<double,std::vector<unsigned_long,std::allocator<unsigned_long>>>const&>
                              (local_160,&local_190);
          std::__detail::_List_node_base::_M_hook(&p_Var21->super__List_node_base);
          psVar1 = &(this->_valConfs).
                    super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    ._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          if (3 < (this->Props).verbose) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\tvalue of inserted valconf = ",0x1d);
            poVar14 = std::ostream::_M_insert<double>(*(double *)(p_Var21->_M_storage)._M_storage);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
            std::ostream::put((char)poVar14);
            std::ostream::flush();
          }
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     ((p_Var21->_M_storage)._M_storage + 8),&local_118);
          if (this->_k <
              (this->_valConfs).
              super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ._M_impl._M_node._M_size) {
            std::__cxx11::
            list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
            ::_M_erase((list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *)local_160,*(_List_node_base **)local_160);
          }
          if ((this->_valConfs).
              super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ._M_impl._M_node._M_size == this->_k) {
            this->_k_th_Val =
                 (double)(this->_valConfs).
                         super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                         ._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
          }
          if (local_190.second.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_190.second.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_190.second.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_190.second.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_c8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_c8.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_c8.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        else if (3 < (this->Props).verbose) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\t*NOT* inserting the newly found configuration",0x2e);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
          std::ostream::put(-0x50);
          std::ostream::flush();
        }
      }
      if (this->bestValue < (double)local_1a8) {
        this->bestValue = (double)local_1a8;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(local_80,&local_118);
        iVar12 = gettimeofday(&local_50,(__timezone_ptr_t)0x0);
        if (iVar12 != 0) {
          puVar22 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar22 = "Error with gettimeofday";
          __cxa_throw(puVar22,&char_const*::typeinfo,0);
        }
        auVar38._0_8_ = (double)(local_50.tv_sec - local_40.tv_sec);
        auVar38._8_8_ = in_XMM3_Qb;
        auVar43._0_8_ = (double)(local_50.tv_usec - local_40.tv_usec);
        auVar43._8_8_ = in_XMM3_Qb;
        auVar38 = vfmadd231sd_fma(auVar43,auVar38,ZEXT816(0x412e848000000000));
        if (this->writeAnyTimeResults == true) {
          poVar14 = std::ostream::_M_insert<double>(this->bestValue);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\t",1);
          poVar14 = std::ostream::_M_insert<double>(auVar38._0_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\t",1);
        }
        if (1 < (this->Props).verbose) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"new best configuration found, value = ",0x26);
          poVar14 = std::ostream::_M_insert<double>(this->bestValue);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
          std::ostream::put((char)poVar14);
          std::ostream::flush();
        }
      }
      if (5 < (this->Props).verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"new messages:",0xd);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
        std::ostream::put(-0x50);
        poVar14 = (ostream *)std::ostream::flush();
        poVar14 = libDAI::operator<<(poVar14,local_a0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
        std::ostream::put((char)poVar14);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ending iteration ",0x11);
        poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
        std::ostream::put((char)poVar14);
        plVar19 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar19 + -0x18) + (char)plVar19);
        std::ostream::put((char)plVar19);
        std::ostream::flush();
      }
      if (local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_118.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      uVar33 = this->_iterations + 1;
      this->_iterations = uVar33;
    } while (uVar33 < (this->Props).maxiter);
  }
  if (this->writeAnyTimeResults == true) {
    cVar8 = (char)this->results_f;
    std::ios::widen((char)*(undefined8 *)(*(long *)this->results_f + -0x18) + cVar8);
    std::ostream::put(cVar8);
    std::ostream::flush();
    cVar8 = (char)this->timings_f;
    std::ios::widen((char)*(undefined8 *)(*(long *)this->timings_f + -0x18) + cVar8);
    std::ostream::put(cVar8);
    std::ostream::flush();
  }
  iVar18._M_current = &local_100._def;
  if (local_100._maxsize <=
      (ulong)((long)local_100.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_100.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3)) {
    iVar18._M_current = local_100._maxpos._M_current;
  }
  if (this->_maxdiff < *iVar18._M_current) {
    this->_maxdiff = *iVar18._M_current;
  }
  if (1 < (this->Props).verbose) {
    if (*iVar18._M_current <= (this->Props).tol) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"MaxPlus::run:  ",0xf);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"converged in ",0xd);
      poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," passes (",9);
      toc();
      poVar14 = std::ostream::_M_insert<long>((long)poVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," clocks).",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"MaxPlus::run:  WARNING: not converged within ",0x2d);
      poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," passes (",9);
      toc();
      poVar14 = std::ostream::_M_insert<long>((long)poVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," clocks)...final maxdiff:",0x19);
      iVar18._M_current = &local_100._def;
      if (local_100._maxsize <=
          (ulong)((long)local_100.super_vector<double,_std::allocator<double>_>.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_100.super_vector<double,_std::allocator<double>_>.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3)) {
        iVar18._M_current = local_100._maxpos._M_current;
      }
      poVar14 = std::ostream::_M_insert<double>(*iVar18._M_current);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    }
    std::ostream::put((char)poVar14);
    std::ostream::flush();
  }
  dVar37 = this->bestValue;
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::~vector(&local_98);
  if (local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_138.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_100.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(local_100.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_100.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return dVar37;
}

Assistant:

double MaxPlus::run() {
        const FactorGraph& g = grm();
        bestValue = -INFINITY;
        if( Props.verbose >= 2 )
            cout << "Starting " << identify() << "..."<<endl;
        if( Props.verbose >= 3)
           cout << endl; 

        struct timeval start_time, cur_time;
        if(gettimeofday(&start_time, NULL) != 0)
            throw "Error with gettimeofday";

        clock_t tic = toc();
        Diffs diffs(g.nrVars(), 1.0);
        
        vector<size_t> edge_seq; //what does this contain? an ordering (sequence) of edge(indice)s ?
        vector<double> residuals;


        //vector<Factor> old_beliefs;
        vector<Prob> old_beliefs;
        old_beliefs.reserve( g.nrVars() );
        for( size_t i = 0; i < g.nrVars(); i++ )
            //old_beliefs.push_back(beliefV(i));
            //FRANS: we don't want a belief in here but simple a vector with all 0's
            //old_beliefs.push_back(  Factor( g.var(i), 0.0 )  );
            old_beliefs.push_back(  Prob( g.var(i).states(), 0.0 )  );

        if( Props.updates == UpdateType::SEQMAX ) {
            // do the first pass
            for(size_t iI = 0; iI < g.nrEdges(); iI++ ) 
                calcNewMessage(iI);

            // calculate initial residuals
            residuals.reserve(g.nrEdges());
            for( size_t iI = 0; iI < g.nrEdges(); iI++ )
                residuals.push_back( dist( _newmessages[iI], _messages[iI], Prob::DISTLINF ) );
        } else {
            edge_seq.reserve( g.nrEdges() );
            for( size_t e = 0; e < g.nrEdges(); e++ )
                edge_seq.push_back( e );
        }

        // do several passes over the network until maximum number of iterations has
        // been reached or until the maximum belief difference is smaller than tolerance
        for( _iterations = 0; _iterations < Props.maxiter && diffs.max() > Props.tol; _iterations++ ) 
        {
            if( Props.verbose >= 6)
            {
               cout << "Start iteration "<<_iterations<<endl ; 
               cout << "old messages:"<< endl << _messages << endl;
            }

            // ---------First update the messages------------
            if( Props.updates == UpdateType::SEQMAX ) {
                // Residuals-MaxPlus by Koller et al.
                for( size_t t = 0; t < g.nrEdges(); t++ ) {
                    // update the message with the largest residual
                    size_t iI = max_element(residuals.begin(), residuals.end()) - residuals.begin();
                    updateMessage( iI );
                    residuals[iI] = 0;

                    // I->i has been updated, which means that residuals for all
                    // J->j with J in nb[i]\I and j in nb[J]\i have to be updated
                    size_t i = g.edge(iI).first;
                    size_t I = g.edge(iI).second;
                    for( FactorGraph::nb_cit J = g.nbV(i).begin(); J != g.nbV(i).end(); J++ ) 
                        if( *J != I )
                            for( FactorGraph::nb_cit j = g.nbF(*J).begin(); j != g.nbF(*J).end(); j++ )
                                if( *j != i ) {
                                    size_t jJ = g.edge(*j,*J);
                                    calcNewMessage(jJ);
                                    residuals[jJ] = dist( _newmessages[jJ], _messages[jJ], Prob::DISTLINF );
                                }
                }
            } else if( Props.updates == UpdateType::PARALL ) {
                // Parallel updates 
                for( size_t t = 0; t < g.nrEdges(); t++ )
                    calcNewMessage(t);

                for( size_t t = 0; t < g.nrEdges(); t++ )
                    updateMessage( t );
            } else {
                // Sequential updates
                if( Props.updates == UpdateType::SEQRND )
                    random_shuffle( edge_seq.begin(), edge_seq.end() );
                
                for( size_t t = 0; t < g.nrEdges(); t++ ) {
                    size_t k = edge_seq[t]; //FRANS: k is what?
                    calcNewMessage( k );
                    updateMessage( k );
                }
            }
            
            // ---------End updating the messages------------


            // compute, for each variable, the value that maximizes the sum of the factors it 
            // participates in.
            // I.e., if v0 is var with 3 values ('states') a,b,c and participates in F0 and F1, 
            // and it received the following messages
            //      Mess F0 -> v0 = [0 6 0 ]
            //      Mess F1 -> v0 = [3 0 0 ]
            // then it should take value b, corresponding to the maximizing index in
            // the vector [3 6 0], which we call the 
            //  `estimated contribution vector' ECV

            //max_indices stores the indices of the maximizing values ('states') for each variable
            vector<size_t> max_indices( g.nrVars() );
            for( size_t i = 0; i < g.nrVars(); i++ )
            {
                /* need not use Factor class here...
                Factor ECV( g.var( i ), 0.0);
                Var i_th_var = g.var(i);
                VarSet temp_vs (i_th_var);
                //loop over factors I that are neighbors of var i
                for( FactorGraph::nb_cit I = g.nbV(i).begin(); I != g.nbV(i).end(); I++ )
                    ECV += Factor( temp_vs, message(i,*I) );
                */
                Prob ECV( g.var(i).states() , 0.0);
                //loop over factors I that are neighbors of var i
                for( FactorGraph::nb_cit I = g.nbV(i).begin(); I != g.nbV(i).end(); I++ )
                    ECV += message(i,*I);

                //find the maximum index (i.e., the value the variable should take according to ECV)
                Real Z = -INFINITY;
                size_t max_val_i = 0;
                for( size_t val_i = 0; val_i < ECV.size(); val_i++ ) {
                    if( ECV[val_i] > Z )
                    {
                        Z = ECV[val_i];
                        max_val_i = val_i;
                    }
                }
                max_indices[i] = max_val_i;
#if 0                
                if( Props.verbose >= 3)
                {
                    cout << "ECV for var "<<i<<" = "<< ECV ;
                    if( Props.verbose >= 4)
                        cout << "->best value of var "<<i<<" is " << max_val_i << " (with expected sum "<<Z<<")";
                    cout << endl;
                }
#endif                 

                //compute distance to last ECV
                Real d =  dist( ECV, old_beliefs[i], Prob::DISTLINF );
                diffs.push( d );
#if 0                
                if( Props.verbose >= 4 ) {
                    if( Props.verbose >= 6 )
                        cout << "\t\t\told_beliefs[i]"<< old_beliefs[i] <<endl << "\t\t\tdist d="<<d<<endl;
                    cout << "\t\tdiffs = "<<diffs<<endl;
                }
#endif                 
                old_beliefs[i] = ECV;
            }
            if( Props.verbose >= 3 )
                cout << "MaxPlus::run:  maxdiff " << diffs.max() << " after " << _iterations+1 << " passes" << endl;

            //compute the value of the currently chosen config
            //
            const std::vector<Factor> & factor_vec = g.factors();
            std::vector<Factor>::const_iterator it = factor_vec.begin();
            std::vector<Factor>::const_iterator last = factor_vec.end();

            double valuesum = 0.0;
            while(it != last) //loop over all factors to compute value
            {
                const Factor & f = *it;
                const VarSet & vs = f.vars();

                //we need to compute the index into f.p() that corresponds to 
                //the (state) configuration as defined by max_indices.
                //
                //suppose the state configuration is <2 1 3 5>, 
                //when f includes vars 1 2 and 4, the relevant configuration is <2 1 5>
                //suppose that the number of states of these relevant vars is <3 4 6>,
                //then the index should be computed as
                //2 + 1 * (3) + 5 * (3*4) = 2 + 3 + 60 = 65
                //
                //(remember the index with the lowest index is the least significant in libDAI)

                //first we construct the vector of 'relevant' indices (those for vs)
                vector<size_t> relevant_state_indices(vs.size());                
                int i=0;
                for(VarSet::const_iterator cit = vs.begin(); cit != vs.end(); cit++)
                { 
                    //the index ('label') of the next of the variable of vs:
                    long lab =  (*cit).label();                    
                    // the (index of the) value(state) that variable
                    //takes in the (estimated) maximizing configuration:
                    //!!! if it crashes here: is the FG connected 'enough' ?! (because it will give problems of not!)
                    //(i.e., if not all variables are included in a factor, things mess up here...)
                    size_t val = max_indices.at(lab);
                    //relevant_state_indices.push_back( val );
                    relevant_state_indices[i] = val;
                    i++;
                }
                //now compute the 'joint factor' index
                size_t facIndex = Factor::IndividualToJointFactorIndex(vs, relevant_state_indices);
                valuesum += f[facIndex];
                it++;
            }
            if( Props.verbose >= 3)
                cout << "current estimated maximizing configuration attains: " << 
                    valuesum << 
                    " (the k=" <<_k<< "-th Value is " << _k_th_Val << ")" << endl;

            if(valuesum > _k_th_Val + V_EPS)
            {
                if( Props.verbose >= 4)
                    cout << "\tchecking to add this configuration to solutions"<<endl;
                list< MADP_util::valConf >::iterator it = _valConfs.begin();
                //boolean that indicates whether we should store max_indices
                bool insert_element = true;
                int pos = 0;
                while(it != _valConfs.end() )
                {
                    valConf& vc = *it;
                    double vcval = vc.first;
                    
                    if( Props.verbose >= 5)
                        cout << "\tchecking to see if it should be inserted before the entry at position "<< pos << " (with value "<<vcval<<")..."<<endl;

                    //boolean that will indicate whether the new found policy needs
                    //to be inserted before vc
                    bool insert_before_vc = false;
                    if( valuesum + V_EPS < vcval)
                    {
                        insert_before_vc = true;
                        if( Props.verbose >= 5)
                            cout << "\tYes!  valuesum("<<valuesum<<") + V_EPS("<<
                                V_EPS<<") < vcval("<<vcval<<" )"<<endl;
                    }
                        
                    if( EqualValue(vcval, valuesum) )
                    {
                        //insert before vc 
                        insert_before_vc = true;
                        if( Props.verbose >= 5)
                            cout << "\tYes!  valuesum("<<valuesum<<") + V_EPS("<<
                                V_EPS<<") == vcval("<<vcval<<" )"<<endl;

                        //but make sure the condigurations are different!
                        vector<size_t>& vcconf=vc.second;
                        bool identical = true;
                        for( size_t i=0; i < vcconf.size(); i++)
                        {
                            if(max_indices.at(i) != vcconf[i] )
                            {
                                identical = false;
                                break;
                            }
                        }
                        if(identical)
                        {
                            if( Props.verbose >= 4)
                                cout <<"\tnewly found conf identical to one already stored..."<<endl;
                            insert_element = false;
                        }
                    }

                    if(insert_before_vc)
                        break;

                    it++;
                    pos++;
                }
                //it now points to the element before which max_indices should be
                //inserted
                if(it == _valConfs.begin() && _valConfs.size() == _k )
                {
                    if( Props.verbose >= 4)
                        cout <<"\tDon't bother value ("<< valuesum <<
                            ") not high enough..."<< endl;
                    //don't bother, since the new one become the k+1-th element
                    insert_element = false;
                }
                if(insert_element)
                {
                    //to avoid uneceesary copying, we insert an 'empty' valconf
                    vector<size_t> v_empty;
                    valConf empty_vc = make_pair(valuesum, v_empty );
                    list< valConf >::iterator new_el_it = _valConfs.insert(it, empty_vc);
                    valConf& new_vc = (*new_el_it);
                    if( Props.verbose >= 4)
                        cout <<"\tvalue of inserted valconf = "<< new_vc.first<<endl;
                    new_vc.second = max_indices;
                    //check to see if we need to delete the last element
                    if(_valConfs.size() > _k)
                        _valConfs.pop_front();
                    if(_valConfs.size() == _k)
                        _k_th_Val = _valConfs.front().first;
                }
                else
                    if( Props.verbose >= 4)
                        cout <<"\t*NOT* inserting the newly found configuration"<< endl;

            }
            if(valuesum > bestValue)
            {
                bestValue = valuesum;
                bestConfiguration = max_indices;
                if(gettimeofday(&cur_time, NULL) != 0)
                    throw "Error with gettimeofday";

                time_t delta_sec = cur_time.tv_sec - start_time.tv_sec;
                suseconds_t delta_usec = cur_time.tv_usec - start_time.tv_usec;
                double delta = 1000000.0 * delta_sec + delta_usec; //in microsecond

                if(writeAnyTimeResults){
                    (*results_f) << bestValue << "\t";
                    (*timings_f) << delta << "\t";
                } 

                if( Props.verbose >= 2)
                    cout << "new best configuration found, value = "<< bestValue << endl;
            }
            if( Props.verbose >= 6)
            {
                cout << "new messages:"<< endl << _messages << endl;
                cout << "ending iteration "<<_iterations<<endl<<endl ; 
            }
        } // <- end of iteration

        //end the line in the results file
        if(writeAnyTimeResults){
            (*results_f) << endl;
            (*timings_f) << endl;
        } 
        
        if( diffs.max() > _maxdiff ) //store the max difference for later inspection.
            _maxdiff = diffs.max();
        if( Props.verbose >= 2 )
        {
            if( diffs.max() > Props.tol ) 
                cout << "MaxPlus::run:  WARNING: not converged within " << Props.maxiter << " passes (" << toc() - tic << " clocks)...final maxdiff:" << diffs.max() << endl;
            else  
                cout << "MaxPlus::run:  " << "converged in " << _iterations << " passes (" << toc() - tic << " clocks)." << endl;
        }
        
        //return diffs.max();
        return bestValue;
    }